

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeParseCellPtrNoPayload(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  u8 uVar1;
  
  uVar1 = sqlite3GetVarint(pCell + 4,(u64 *)pInfo);
  pInfo->nSize = (ushort)(byte)(uVar1 + 4);
  pInfo->nPayload = 0;
  pInfo->nLocal = 0;
  pInfo->pPayload = (u8 *)0x0;
  return;
}

Assistant:

static void btreeParseCellPtrNoPayload(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 );
  assert( pPage->childPtrSize==4 );
#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER(pPage);
#endif
  pInfo->nSize = 4 + getVarint(&pCell[4], (u64*)&pInfo->nKey);
  pInfo->nPayload = 0;
  pInfo->nLocal = 0;
  pInfo->pPayload = 0;
  return;
}